

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UObject * __thiscall
icu_63::ICUService::getKey
          (ICUService *this,ICUServiceKey *key,UnicodeString *actualReturn,
          ICUServiceFactory *factory,UErrorCode *status)

{
  ushort uVar1;
  UErrorCode UVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ICUServiceFactory *pIVar7;
  Hashtable *this_00;
  UMemory *this_01;
  long *plVar8;
  UnicodeString *pUVar9;
  UnicodeString *pUVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar11;
  code *pcVar12;
  size_t size;
  void *p;
  int32_t iVar13;
  uint index;
  UHashtable *pUVar14;
  XMutex mutex;
  UnicodeString currentDescriptor;
  UVector *local_b8;
  UObject *local_b0;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return (UObject *)0x0;
  }
  pcVar12 = (code *)key;
  iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xc])();
  if ((char)iVar5 != '\0') {
    iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    return (UObject *)CONCAT44(extraout_var,iVar5);
  }
  if (factory == (ICUServiceFactory *)0x0) {
    umtx_lock_63((UMutex *)lock);
  }
  if (this->serviceCache != (Hashtable *)0x0) {
LAB_0032716c:
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    iVar5 = this->factories->count;
    if (factory == (ICUServiceFactory *)0x0) {
      iVar11 = 0;
LAB_00327267:
      if (iVar5 < iVar11) {
        iVar5 = iVar11;
      }
      local_b8 = (UVector *)0x0;
      bVar3 = false;
      do {
        uVar1 = local_70.fUnion.fStackFields.fLengthAndFlags & 1;
        local_70.fUnion.fStackFields.fLengthAndFlags =
             local_70.fUnion.fStackFields.fLengthAndFlags & 0x1e;
        if (uVar1 != 0) {
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        }
        (*(key->super_UObject)._vptr_UObject[6])(key,&local_70);
        pcVar12 = (code *)&local_70;
        this_01 = (UMemory *)uhash_get_63(this->serviceCache->hash,pcVar12);
        iVar13 = iVar11;
        if (this_01 != (UMemory *)0x0) {
LAB_0032740a:
          if (!bVar3 || factory != (ICUServiceFactory *)0x0) goto LAB_00327422;
          Hashtable::put(this->serviceCache,(UnicodeString *)(this_01 + 8),this_01,status);
          if (U_ZERO_ERROR < *status) {
            local_b0 = (UObject *)0x0;
            goto LAB_0032766c;
          }
          if (local_b8 == (UVector *)0x0) goto LAB_00327422;
          index = local_b8->count;
          local_b0 = (UObject *)0x0;
          goto LAB_0032750d;
        }
        while (iVar5 != iVar13) {
          plVar8 = (long *)UVector::elementAt(this->factories,iVar13);
          pcVar12 = (code *)key;
          plVar8 = (long *)(**(code **)(*plVar8 + 0x18))(plVar8,key,this,status);
          if (U_ZERO_ERROR < *status) {
            bVar3 = true;
            if (plVar8 != (long *)0x0) {
              (**(code **)(*plVar8 + 8))(plVar8);
            }
            goto LAB_00327467;
          }
          iVar13 = iVar13 + 1;
          if (plVar8 != (long *)0x0) {
            this_01 = (UMemory *)UMemory::operator_new((UMemory *)0x50,(size_t)pcVar12);
            if (this_01 == (UMemory *)0x0) {
              (**(code **)(*plVar8 + 8))(plVar8);
              goto LAB_00327452;
            }
            *(undefined4 *)this_01 = 1;
            icu_63::UnicodeString::UnicodeString((UnicodeString *)(this_01 + 8),&local_70);
            *(long **)(this_01 + 0x48) = plVar8;
            bVar3 = true;
            goto LAB_0032740a;
          }
        }
        if (local_b8 == (UVector *)0x0) {
          local_b8 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pcVar12);
          if (local_b8 != (UVector *)0x0) {
            pcVar12 = uprv_deleteUObject_63;
            UVector::UVector(local_b8,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,5,status);
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0032734d;
LAB_0032765d:
          bVar3 = true;
          goto LAB_00327467;
        }
LAB_0032734d:
        pUVar9 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pcVar12);
        if ((pUVar9 == (UnicodeString *)0x0) ||
           (icu_63::UnicodeString::UnicodeString(pUVar9,&local_70),
           (undefined1  [56])((undefined1  [56])pUVar9->fUnion & (undefined1  [56])0x1) !=
           (undefined1  [56])0x0)) {
LAB_00327452:
          *status = U_MEMORY_ALLOCATION_ERROR;
          bVar3 = true;
          goto LAB_00327467;
        }
        UVector::addElement(local_b8,pUVar9,status);
        if (U_ZERO_ERROR < *status) goto LAB_0032765d;
        iVar6 = (*(key->super_UObject)._vptr_UObject[7])();
        bVar3 = true;
      } while ((char)iVar6 != '\0');
      bVar3 = false;
LAB_00327467:
      local_b0 = (UObject *)0x0;
      goto LAB_00327672;
    }
    if (0 < iVar5) {
      iVar11 = 0;
      do {
        pIVar7 = (ICUServiceFactory *)UVector::elementAt(this->factories,iVar11);
        if (pIVar7 == factory) {
          iVar11 = iVar11 + 1;
          goto LAB_00327267;
        }
        iVar11 = iVar11 + 1;
      } while (iVar5 != iVar11);
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    bVar3 = true;
    local_b0 = (UObject *)0x0;
    goto LAB_00327681;
  }
  this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar12);
  if (this_00 == (Hashtable *)0x0) {
    this->serviceCache = (Hashtable *)0x0;
  }
  else {
    this_00->hash = (UHashtable *)0x0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar14 = &this_00->hashObj;
      pcVar12 = uhash_hashUnicodeString_63;
      uhash_init_63(pUVar14,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                    (undefined1 *)0x0,status);
      if (U_ZERO_ERROR < *status) goto LAB_00327227;
      this_00->hash = pUVar14;
      pcVar12 = uprv_deleteUObject_63;
      uhash_setKeyDeleter_63(pUVar14,uprv_deleteUObject_63);
      UVar2 = *status;
      this->serviceCache = this_00;
      if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
        uhash_setValueDeleter_63(this_00->hash,cacheDeleter);
        goto LAB_0032716c;
      }
    }
    else {
LAB_00327227:
      this->serviceCache = this_00;
    }
    Hashtable::~Hashtable(this_00);
    UMemory::operator_delete((UMemory *)this_00,pcVar12);
  }
  if (factory != (ICUServiceFactory *)0x0) {
    return (UObject *)0x0;
  }
  local_b0 = (UObject *)0x0;
  bVar3 = false;
LAB_0032769e:
  umtx_unlock_63((UMutex *)lock);
LAB_003276a8:
  if (bVar3) {
    iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
    local_b0 = (UObject *)CONCAT44(extraout_var_01,iVar5);
  }
  return local_b0;
LAB_0032750d:
  if ((int)index < 1) goto LAB_00327422;
  index = index - 1;
  size = (size_t)index;
  pUVar9 = (UnicodeString *)UVector::elementAt(local_b8,index);
  pUVar14 = this->serviceCache->hash;
  pUVar10 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
  if (pUVar10 != (UnicodeString *)0x0) {
    icu_63::UnicodeString::UnicodeString(pUVar10,pUVar9);
  }
  uhash_put_63(pUVar14,pUVar10,this_01,status);
  if (U_ZERO_ERROR < *status) goto LAB_0032766c;
  *(int *)this_01 = *(int *)this_01 + 1;
  UVector::removeElementAt(local_b8,index);
  goto LAB_0032750d;
LAB_00327422:
  if (actualReturn == (UnicodeString *)0x0) {
LAB_003275dd:
    p = *(void **)(this_01 + 0x48);
    iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xe])(this);
    local_b0 = (UObject *)CONCAT44(extraout_var_00,iVar5);
    if (bVar3 && factory != (ICUServiceFactory *)0x0) {
      if (*(long **)(this_01 + 0x48) != (long *)0x0) {
        (**(code **)(**(long **)(this_01 + 0x48) + 8))();
      }
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)(this_01 + 8));
      UMemory::operator_delete(this_01,p);
    }
LAB_0032766c:
    bVar3 = true;
  }
  else {
    pUVar9 = (UnicodeString *)(this_01 + 8);
    if (*(short *)(this_01 + 0x10) < 0) {
      iVar13 = *(int32_t *)(this_01 + 0x14);
    }
    else {
      iVar13 = (int)*(short *)(this_01 + 0x10) >> 5;
    }
    iVar13 = icu_63::UnicodeString::doIndexOf(pUVar9,L'/',0,iVar13);
    pUVar10 = pUVar9;
    if (iVar13 == 0) {
      uVar1 = (actualReturn->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = 2;
      if ((uVar1 & 1) == 0) {
        uVar4 = uVar1 & 0x1e;
      }
      (actualReturn->fUnion).fStackFields.fLengthAndFlags = uVar4;
      if (*(short *)(this_01 + 0x10) < 0) {
        iVar5 = *(int *)(this_01 + 0x14);
      }
      else {
        iVar5 = (int)*(short *)(this_01 + 0x10) >> 5;
      }
      icu_63::UnicodeString::doAppend(actualReturn,pUVar9,1,iVar5 + -1);
    }
    else {
      icu_63::UnicodeString::operator=(actualReturn,pUVar9);
    }
    if ((undefined1  [56])((undefined1  [56])actualReturn->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) goto LAB_003275dd;
    *status = U_MEMORY_ALLOCATION_ERROR;
    if (*(long **)(this_01 + 0x48) != (long *)0x0) {
      (**(code **)(**(long **)(this_01 + 0x48) + 8))();
    }
    icu_63::UnicodeString::~UnicodeString(pUVar9);
    UMemory::operator_delete(this_01,pUVar10);
    bVar3 = true;
    local_b0 = (UObject *)0x0;
  }
LAB_00327672:
  if (local_b8 != (UVector *)0x0) {
    (*(local_b8->super_UObject)._vptr_UObject[1])(local_b8);
  }
LAB_00327681:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  bVar3 = !bVar3;
  if (factory != (ICUServiceFactory *)0x0) goto LAB_003276a8;
  goto LAB_0032769e;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}